

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

void __thiscall
google::protobuf::io::ConcatenatingInputStream::BackUp(ConcatenatingInputStream *this,int count)

{
  LogMessage *other;
  undefined4 in_register_00000034;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (0 < this->stream_count_) {
    (*(*this->streams_)->_vptr_ZeroCopyInputStream[3])
              (*this->streams_,CONCAT44(in_register_00000034,count));
    return;
  }
  internal::LogMessage::LogMessage
            (&local_40,LOGLEVEL_DFATAL,"third_party/protobuf-lite/zero_copy_stream_impl.cc",0x147);
  other = internal::LogMessage::operator<<(&local_40,"Can\'t BackUp() after failed Next().");
  internal::LogFinisher::operator=(&local_41,other);
  internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

void ConcatenatingInputStream::BackUp(int count) {
  if (stream_count_ > 0) {
    streams_[0]->BackUp(count);
  } else {
    GOOGLE_LOG(DFATAL) << "Can't BackUp() after failed Next().";
  }
}